

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::printTestRunTotals(ostream *stream,ColourImpl *streamColour,Totals *totals)

{
  Totals *pTVar1;
  bool bVar2;
  uint64_t uVar3;
  ostream *poVar4;
  SummaryColumn *pSVar5;
  StringRef SVar6;
  StringRef label;
  size_t in_stack_fffffffffffffc08;
  ColourImpl *pCVar7;
  ColourImpl *local_310;
  char *local_308;
  ColourImpl *local_300;
  char *local_2f8;
  allocator<char> local_2e9;
  string local_2e8;
  SummaryColumn local_2c8;
  allocator<char> local_279;
  string local_278;
  SummaryColumn local_258;
  allocator<char> local_209;
  string local_208;
  SummaryColumn local_1e8;
  allocator<char> local_199;
  string local_198;
  SummaryColumn local_178;
  allocator<char> local_129;
  string local_128;
  SummaryColumn local_108;
  uint64_t local_c0;
  uint64_t totalAssertionCount;
  vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
  columns;
  pluralise local_90;
  StringRef local_78;
  pluralise local_68;
  ColourGuard local_50 [2];
  ColourGuard local_30;
  Totals *local_20;
  Totals *totals_local;
  ColourImpl *streamColour_local;
  ostream *stream_local;
  
  local_20 = totals;
  totals_local = (Totals *)streamColour;
  streamColour_local = (ColourImpl *)stream;
  uVar3 = Counts::total(&totals->testCases);
  pCVar7 = streamColour_local;
  if (uVar3 == 0) {
    ColourImpl::guardColour((ColourImpl *)&local_30,(Code)totals_local);
    poVar4 = operator<<((ostream *)pCVar7,&local_30);
    std::operator<<(poVar4,"No tests ran\n");
    ColourImpl::ColourGuard::~ColourGuard(&local_30);
  }
  else {
    uVar3 = Counts::total(&local_20->assertions);
    if ((uVar3 == 0) ||
       (bVar2 = Counts::allPassed(&local_20->testCases), pCVar7 = streamColour_local, !bVar2)) {
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::vector((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                *)&totalAssertionCount);
      local_c0 = Counts::total(&local_20->assertions);
      local_c0 = local_c0 - (local_20->assertions).skipped;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
      anon_unknown_26::SummaryColumn::SummaryColumn(&local_108,&local_128,None);
      uVar3 = Counts::total(&local_20->testCases);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(&local_108,uVar3);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(pSVar5,local_c0);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&totalAssertionCount,pSVar5);
      anon_unknown_26::SummaryColumn::~SummaryColumn(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"passed",&local_199);
      anon_unknown_26::SummaryColumn::SummaryColumn(&local_178,&local_198,Green);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(&local_178,(local_20->testCases).passed);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(pSVar5,(local_20->assertions).passed);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&totalAssertionCount,pSVar5);
      anon_unknown_26::SummaryColumn::~SummaryColumn(&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"failed",&local_209);
      anon_unknown_26::SummaryColumn::SummaryColumn(&local_1e8,&local_208,BrightRed);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(&local_1e8,(local_20->testCases).failed);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(pSVar5,(local_20->assertions).failed);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&totalAssertionCount,pSVar5);
      anon_unknown_26::SummaryColumn::~SummaryColumn(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"skipped",&local_279);
      anon_unknown_26::SummaryColumn::SummaryColumn(&local_258,&local_278,FileName);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(&local_258,(local_20->testCases).skipped);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(pSVar5,0);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&totalAssertionCount,pSVar5);
      anon_unknown_26::SummaryColumn::~SummaryColumn(&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"failed as expected",&local_2e9);
      anon_unknown_26::SummaryColumn::SummaryColumn(&local_2c8,&local_2e8,BrightYellow);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(&local_2c8,(local_20->testCases).failedButOk);
      pSVar5 = anon_unknown_26::SummaryColumn::addRow(pSVar5,(local_20->assertions).failedButOk);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&totalAssertionCount,pSVar5);
      anon_unknown_26::SummaryColumn::~SummaryColumn(&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      pCVar7 = streamColour_local;
      pTVar1 = totals_local;
      SVar6 = operator____sr("test cases",10);
      local_300 = (ColourImpl *)SVar6.m_start;
      local_2f8 = (char *)SVar6.m_size;
      SVar6.m_size = (size_type)&totalAssertionCount;
      SVar6.m_start = local_2f8;
      anon_unknown_26::printSummaryRow
                ((anon_unknown_26 *)pCVar7,(ostream *)pTVar1,local_300,SVar6,
                 (vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                  *)0x0,in_stack_fffffffffffffc08);
      pTVar1 = totals_local;
      pCVar7 = streamColour_local;
      SVar6 = operator____sr("assertions",10);
      local_310 = (ColourImpl *)SVar6.m_start;
      local_308 = (char *)SVar6.m_size;
      label.m_size = (size_type)&totalAssertionCount;
      label.m_start = local_308;
      anon_unknown_26::printSummaryRow
                ((anon_unknown_26 *)pCVar7,(ostream *)pTVar1,local_310,label,
                 (vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                  *)0x1,(size_t)pCVar7);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::~vector((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                 *)&totalAssertionCount);
    }
    else {
      ColourImpl::guardColour((ColourImpl *)local_50,(Code)totals_local);
      poVar4 = operator<<((ostream *)pCVar7,local_50);
      std::operator<<(poVar4,"All tests passed");
      ColourImpl::ColourGuard::~ColourGuard(local_50);
      poVar4 = std::operator<<((ostream *)streamColour_local," (");
      uVar3 = (local_20->assertions).passed;
      local_78 = operator____sr("assertion",9);
      pluralise::pluralise(&local_68,uVar3,local_78);
      poVar4 = operator<<(poVar4,&local_68);
      poVar4 = std::operator<<(poVar4," in ");
      uVar3 = (local_20->testCases).passed;
      join_0x00000010_0x00000000_ = operator____sr("test case",9);
      pluralise::pluralise(&local_90,uVar3,join_0x00000010_0x00000000_);
      poVar4 = operator<<(poVar4,&local_90);
      poVar4 = std::operator<<(poVar4,')');
      std::operator<<(poVar4,'\n');
    }
  }
  return;
}

Assistant:

void printTestRunTotals( std::ostream& stream,
                             ColourImpl& streamColour,
                             Totals const& totals ) {
        if ( totals.testCases.total() == 0 ) {
            stream << streamColour.guardColour( Colour::Warning )
                   << "No tests ran\n";
            return;
        }

        if ( totals.assertions.total() > 0 && totals.testCases.allPassed() ) {
            stream << streamColour.guardColour( Colour::ResultSuccess )
                   << "All tests passed";
            stream << " ("
                   << pluralise( totals.assertions.passed, "assertion"_sr )
                   << " in "
                   << pluralise( totals.testCases.passed, "test case"_sr )
                   << ')' << '\n';
            return;
        }

        std::vector<SummaryColumn> columns;
        // Don't include "skipped assertions" in total count
        const auto totalAssertionCount =
            totals.assertions.total() - totals.assertions.skipped;
        columns.push_back( SummaryColumn( "", Colour::None )
                               .addRow( totals.testCases.total() )
                               .addRow( totalAssertionCount ) );
        columns.push_back( SummaryColumn( "passed", Colour::Success )
                               .addRow( totals.testCases.passed )
                               .addRow( totals.assertions.passed ) );
        columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                               .addRow( totals.testCases.failed )
                               .addRow( totals.assertions.failed ) );
        columns.push_back( SummaryColumn( "skipped", Colour::Skip )
                               .addRow( totals.testCases.skipped )
                               // Don't print "skipped assertions"
                               .addRow( 0 ) );
        columns.push_back(
            SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                .addRow( totals.testCases.failedButOk )
                .addRow( totals.assertions.failedButOk ) );
        printSummaryRow( stream, streamColour, "test cases"_sr, columns, 0 );
        printSummaryRow( stream, streamColour, "assertions"_sr, columns, 1 );
    }